

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<char,_char,_5>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(char *t,char *u,char *result)

{
  char cVar1;
  char cVar2;
  
  cVar1 = *u;
  if (cVar1 == '\0') {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  cVar2 = *t;
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    if (cVar1 == -1 && cVar2 == -0x80) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    cVar2 = cVar2 / cVar1;
  }
  *result = cVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }